

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O0

void __thiscall helics::MultiBroker::MultiBroker(MultiBroker *this)

{
  undefined8 *in_RDI;
  CoreBroker *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar1;
  
  uVar1 = 0;
  CoreBroker::CoreBroker(unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  *in_RDI = &PTR__MultiBroker_00a5c778;
  in_RDI[1] = &PTR__MultiBroker_00a5c8d8;
  CLI::std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
             (__integral_type)((ulong)in_RDI >> 0x20));
  CLI::std::
  vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
  ::vector((vector<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>,_std::allocator<std::unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>_>_>
            *)0x1f15ec);
  std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>::
  unique_ptr<std::default_delete<helics::CommsInterface>,void>
            ((unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *)
             CONCAT44(uVar1,in_stack_fffffffffffffff0));
  NetworkBrokerData::NetworkBrokerData
            ((NetworkBrokerData *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
             (InterfaceTypes)((ulong)in_RDI >> 0x38));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unaff_retaddr);
  CLI::std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
             SUB81((ulong)in_RDI >> 0x38,0));
  *(undefined4 *)((long)in_RDI + 0xfac) = 0x2d;
  CLI::std::
  vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>::
  vector((vector<std::pair<helics::route_id,_int>,_std::allocator<std::pair<helics::route_id,_int>_>_>
          *)0x1f164e);
  return;
}

Assistant:

MultiBroker::MultiBroker() noexcept {}